

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall QFileDialogPrivate::updateOkButtonText(QFileDialogPrivate *this,bool saveAsOnFolder)

{
  byte bVar1;
  FileMode FVar2;
  AcceptMode AVar3;
  QFileDialog *this_00;
  QFileDialogOptions *pQVar4;
  ulong uVar5;
  byte in_SIL;
  QFileDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  QFileDialog *q;
  int n;
  undefined7 in_stack_ffffffffffffff88;
  QString *in_stack_ffffffffffffffa0;
  DialogLabel in_stack_ffffffffffffffac;
  QFileDialogPrivate *in_stack_ffffffffffffffb0;
  undefined1 local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_SIL & 1;
  this_00 = q_func(in_RDI);
  n = (int)((ulong)in_RDI >> 0x20);
  if ((bVar1 & 1) == 0) {
    pQVar4 = QSharedPointer<QFileDialogOptions>::operator->
                       ((QSharedPointer<QFileDialogOptions> *)0x751740);
    uVar5 = QFileDialogOptions::isLabelExplicitlySet((DialogLabel)pQVar4);
    if ((uVar5 & 1) == 0) {
      FVar2 = QFileDialog::fileMode(this_00);
      if (FVar2 == Directory) {
        QFileDialog::tr((char *)CONCAT17(bVar1,in_stack_ffffffffffffff88),(char *)this_00,n);
        setLabelTextControl(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                            in_stack_ffffffffffffffa0);
        QString::~QString((QString *)0x7517df);
      }
      else {
        AVar3 = QFileDialog::acceptMode(this_00);
        if (AVar3 == AcceptOpen) {
          QFileDialog::tr((char *)CONCAT17(bVar1,in_stack_ffffffffffffff88),(char *)this_00,n);
        }
        else {
          QFileDialog::tr((char *)CONCAT17(bVar1,in_stack_ffffffffffffff88),(char *)this_00,n);
        }
        setLabelTextControl(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                            in_stack_ffffffffffffffa0);
        QString::~QString((QString *)0x751843);
      }
    }
    else {
      QSharedPointer<QFileDialogOptions>::operator->((QSharedPointer<QFileDialogOptions> *)0x751763)
      ;
      QFileDialogOptions::labelText((DialogLabel)local_38);
      setLabelTextControl(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                          in_stack_ffffffffffffffa0);
      QString::~QString((QString *)0x751792);
    }
  }
  else {
    QFileDialog::tr((char *)CONCAT17(bVar1,in_stack_ffffffffffffff88),(char *)this_00,n);
    setLabelTextControl(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                        in_stack_ffffffffffffffa0);
    QString::~QString((QString *)0x75172b);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileDialogPrivate::updateOkButtonText(bool saveAsOnFolder)
{
    Q_Q(QFileDialog);
    // 'Save as' at a folder: Temporarily change to "Open".
    if (saveAsOnFolder) {
        setLabelTextControl(QFileDialog::Accept, QFileDialog::tr("&Open"));
    } else if (options->isLabelExplicitlySet(QFileDialogOptions::Accept)) {
        setLabelTextControl(QFileDialog::Accept, options->labelText(QFileDialogOptions::Accept));
        return;
    } else {
        switch (q->fileMode()) {
        case QFileDialog::Directory:
            setLabelTextControl(QFileDialog::Accept, QFileDialog::tr("&Choose"));
            break;
        default:
            setLabelTextControl(QFileDialog::Accept,
                                q->acceptMode() == QFileDialog::AcceptOpen ?
                                    QFileDialog::tr("&Open")  :
                                    QFileDialog::tr("&Save"));
            break;
        }
    }
}